

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O0

void __thiscall
TPZFrontSym<std::complex<double>_>::AddKel
          (TPZFrontSym<std::complex<double>_> *this,TPZFMatrix<std::complex<double>_> *elmat,
          TPZVec<long> *sourceindex,TPZVec<long> *destinationindex)

{
  int iVar1;
  TPZFrontSym<std::complex<double>_> *this_00;
  TPZFMatrix<std::complex<double>_> *this_01;
  long *plVar2;
  complex<double> *i_00;
  TPZVec<long> *in_RCX;
  TPZVec<long> *in_RDX;
  complex<double> *in_RSI;
  TPZFrontSym<std::complex<double>_> *in_RDI;
  int64_t nel;
  int64_t jlocal;
  int64_t ilocal;
  int64_t j;
  int64_t i;
  complex<double> *__z;
  complex<double> *this_02;
  undefined8 local_30;
  undefined8 local_28;
  
  this_00 = (TPZFrontSym<std::complex<double>_> *)TPZVec<long>::NElements(in_RDX);
  for (local_28 = 0; local_28 < (long)this_00; local_28 = local_28 + 1) {
    TPZVec<long>::operator[](in_RCX,local_28);
    Local(this_00,(int64_t)in_RDI);
    for (local_30 = local_28; local_30 < (long)this_00; local_30 = local_30 + 1) {
      TPZVec<long>::operator[](in_RCX,local_30);
      iVar1 = Local(this_00,(int64_t)in_RDI);
      this_01 = (TPZFMatrix<std::complex<double>_> *)(long)iVar1;
      __z = in_RSI;
      plVar2 = TPZVec<long>::operator[](in_RDX,local_28);
      this_02 = (complex<double> *)*plVar2;
      TPZVec<long>::operator[](in_RDX,local_30);
      i_00 = TPZFMatrix<std::complex<double>_>::operator()(this_01,(int64_t)this_00,(int64_t)in_RDI)
      ;
      Element(in_RDI,(int64_t)i_00,(int64_t)this_02);
      std::complex<double>::operator+=(this_02,__z);
    }
  }
  return;
}

Assistant:

void TPZFrontSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &sourceindex,  TPZVec<int64_t> &destinationindex)
{
	int64_t i, j, ilocal, jlocal, nel;
	nel=sourceindex.NElements();
	for (i = 0; i < nel; i++) {
		// message #1.1.1 to this:TPZFront
		ilocal = this->Local(destinationindex[i]);
		for (j = i; j < nel; j++) {
			// message #1.1.2.1 to this:TPZFront
			jlocal = this->Local(destinationindex[j]);
			
			// message #1.1.2.2 to this:TPZFront
			this->Element(ilocal, jlocal)+=elmat(sourceindex[i],sourceindex[j]);
		}
	}
}